

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmTextureCalc::ExpandWidth
          (GmmTextureCalc *this,uint32_t Width,uint32_t UnitAlignment,uint32_t NumSamples)

{
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  uint local_20;
  uint32_t ExpandedWidth;
  uint32_t NumSamples_local;
  uint32_t UnitAlignment_local;
  uint32_t Width_local;
  GmmTextureCalc *this_local;
  
  local_20 = Width;
  switch(NumSamples) {
  case 1:
    break;
  case 2:
  case 4:
    local_2c = Width;
    if (Width < 2) {
      local_2c = 1;
    }
    local_20 = (local_2c + 1 >> 1) << 2;
    break;
  default:
    break;
  case 8:
  case 0x10:
    local_30 = Width;
    if (Width < 2) {
      local_30 = 1;
    }
    local_20 = (local_30 + 1 >> 1) << 3;
  }
  local_34 = UnitAlignment;
  if (UnitAlignment < local_20) {
    local_34 = local_20;
  }
  if (UnitAlignment == 0) {
    local_38 = local_34;
  }
  else {
    local_38 = local_34 + ((UnitAlignment - 1) - (local_34 + (UnitAlignment - 1)) % UnitAlignment);
  }
  return local_38;
}

Assistant:

uint32_t GmmLib::GmmTextureCalc::ExpandWidth(uint32_t Width, uint32_t UnitAlignment, uint32_t NumSamples)
{
    uint32_t ExpandedWidth;

    switch(NumSamples)
    {
        case 1:
            ExpandedWidth = Width;
            break;
        case 2: // Same as 4x...
        case 4:
            ExpandedWidth = GFX_CEIL_DIV(GFX_MAX(Width, 1), 2) * 4;
            break;
        case 8: // Same as 16x...
        case 16:
            ExpandedWidth = GFX_CEIL_DIV(GFX_MAX(Width, 1), 2) * 8;
            break;
        default:
            ExpandedWidth = Width;
            __GMM_ASSERT(0);
    }

    ExpandedWidth = GFX_MAX(ExpandedWidth, UnitAlignment);
    ExpandedWidth = GFX_ALIGN_NP2(ExpandedWidth, UnitAlignment);

    return (ExpandedWidth);
}